

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

bool __thiscall implementations::scheme::SchemeFrame::dispatchCall(SchemeFrame *this)

{
  const_iterator it;
  bool bVar1;
  _instruction_type _Var2;
  undefined8 *puVar3;
  
  it._M_current =
       (this->resolved_arguments).
       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2 = SchemeInstructionConverter::convert(&this->exp);
  switch(_Var2) {
  case If:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)1>::dispatch
                      (this,it);
    return bVar1;
  case Set:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)2>::dispatch
                      (this,it);
    return bVar1;
  case Define:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)3>::dispatch
                      (this,it);
    return bVar1;
  default:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_00130c80;
    __cxa_throw(puVar3,&stackless::
                        InvalidOperation<implementations::scheme::instruction::instruction,int,int>
                        ::typeinfo,std::exception::~exception);
  case Begin:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)5>::dispatch
                      (this,it);
    return bVar1;
  case Proc:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)6>::dispatch
                      (this,it);
    return bVar1;
  }
}

Assistant:

bool SchemeFrame::dispatchCall() {
	// all of our arguments are now resolved, dispatch
	cells::const_iterator it = resolved_arguments.cbegin();
	instruction::instruction ins = SchemeInstructionConverter::convert(exp);
	switch (ins) {
	case instruction::If:
		return SchemeDispatcher<instruction::If>::dispatch(*this, it);
	case instruction::Begin:
		return SchemeDispatcher<instruction::Begin>::dispatch(*this, it);
	case instruction::Set:
		return SchemeDispatcher<instruction::Set>::dispatch(*this, it);
	case instruction::Define:
		return SchemeDispatcher<instruction::Define>::dispatch(*this, it);
	case instruction::Proc:
		return SchemeDispatcher<instruction::Proc>::dispatch(*this, it);
	default:
		return SchemeDispatcher<instruction::Invalid>::dispatch(*this, it);
	}
}